

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode Curl_none_shutdown(Curl_cfilter *cf,Curl_easy *data,_Bool send_shutdown,_Bool *done)

{
  _Bool *done_local;
  _Bool send_shutdown_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  *done = true;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_none_shutdown(struct Curl_cfilter *cf UNUSED_PARAM,
                            struct Curl_easy *data UNUSED_PARAM,
                            bool send_shutdown UNUSED_PARAM,
                            bool *done)
{
  (void)data;
  (void)cf;
  (void)send_shutdown;
  /* Every SSL backend should have a shutdown implementation. Until we
   * have implemented that, we put this fake in place. */
  *done = TRUE;
  return CURLE_OK;
}